

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O0

void helper_crypto_sm3partw1_arm(void *vd,void *vn,void *vm)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint word;
  uint32_t uVar10;
  uint32_t t;
  CRYPTO_STATE m;
  CRYPTO_STATE n;
  CRYPTO_STATE d;
  uint64_t *rm;
  uint64_t *rn;
  uint64_t *rd;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  uVar1 = *vd;
  uVar2 = *(undefined8 *)((long)vd + 8);
  uVar3 = *vn;
  uVar4 = *(undefined8 *)((long)vn + 8);
  uVar5 = *(undefined8 *)((long)vm + 8);
  n.words[2] = (uint32_t)uVar1;
  m.words[2] = (uint32_t)uVar3;
  t = (uint32_t)((ulong)*vm >> 0x20);
  uVar6 = ror32(t,0x11);
  uVar7 = n.words[2] ^ m.words[2] ^ uVar6;
  uVar6 = ror32(uVar7,0x11);
  uVar8 = ror32(uVar7,9);
  n.words[2] = uVar7 ^ uVar6 ^ uVar8;
  n.words[3] = (uint32_t)((ulong)uVar1 >> 0x20);
  m.words[3] = (uint32_t)((ulong)uVar3 >> 0x20);
  m.words[0] = (uint32_t)uVar5;
  uVar6 = ror32(m.words[0],0x11);
  uVar7 = n.words[3] ^ m.words[3] ^ uVar6;
  uVar6 = ror32(uVar7,0x11);
  uVar8 = ror32(uVar7,9);
  n.words[3] = uVar7 ^ uVar6 ^ uVar8;
  d.words[0] = (uint32_t)uVar2;
  n.words[0] = (uint32_t)uVar4;
  m.words[1] = (uint32_t)((ulong)uVar5 >> 0x20);
  uVar6 = ror32(m.words[1],0x11);
  uVar7 = d.words[0] ^ n.words[0] ^ uVar6;
  uVar6 = ror32(uVar7,0x11);
  uVar8 = ror32(uVar7,9);
  d.words[1] = (uint32_t)((ulong)uVar2 >> 0x20);
  n.words[1] = (uint32_t)((ulong)uVar4 >> 0x20);
  uVar9 = ror32(n.words[2],0x11);
  word = d.words[1] ^ n.words[1] ^ uVar9;
  uVar9 = ror32(word,0x11);
  uVar10 = ror32(word,9);
  d.words[1] = word ^ uVar9 ^ uVar10;
  d.words[0] = uVar7 ^ uVar6 ^ uVar8;
  *(uint64_t *)vd = n.l[1];
  *(uint64_t *)((long)vd + 8) = d.l[0];
  return;
}

Assistant:

void HELPER(crypto_sm3partw1)(void *vd, void *vn, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };
    uint32_t t;

    t = CR_ST_WORD(d, 0) ^ CR_ST_WORD(n, 0) ^ ror32(CR_ST_WORD(m, 1), 17);
    CR_ST_WORD(d, 0) = t ^ ror32(t, 17) ^ ror32(t, 9);

    t = CR_ST_WORD(d, 1) ^ CR_ST_WORD(n, 1) ^ ror32(CR_ST_WORD(m, 2), 17);
    CR_ST_WORD(d, 1) = t ^ ror32(t, 17) ^ ror32(t, 9);

    t = CR_ST_WORD(d, 2) ^ CR_ST_WORD(n, 2) ^ ror32(CR_ST_WORD(m, 3), 17);
    CR_ST_WORD(d, 2) = t ^ ror32(t, 17) ^ ror32(t, 9);

    t = CR_ST_WORD(d, 3) ^ CR_ST_WORD(n, 3) ^ ror32(CR_ST_WORD(d, 0), 17);
    CR_ST_WORD(d, 3) = t ^ ror32(t, 17) ^ ror32(t, 9);

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}